

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_> *
libcellml::unitsUsed
          (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *__return_storage_ptr__,ModelPtr *model,ComponentConstPtr *component)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Model *pMVar4;
  EntityImpl *this;
  ModelPtr *pMVar5;
  element_type *peVar6;
  const_iterator cVar7;
  size_t sVar8;
  string *psVar9;
  ulong uVar10;
  bool bVar11;
  UnitsPtr u;
  NameList componentCnUnitsNames;
  VariablePtr v;
  UnitsPtr modelUnits;
  UnitsPtr availableUnits;
  Model local_c8;
  ModelPtr *local_a8;
  libcellml *local_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  undefined1 local_58 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._16_8_ = (element_type *)0x0;
  local_c8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  local_a8 = model;
  local_a0 = (libcellml *)component;
  do {
    peVar6 = (element_type *)Component::variableCount(*(Component **)local_a0);
    if (peVar6 <= (ulong)local_58._16_8_) {
      findComponentCnUnitsNames_abi_cxx11_
                ((NameList *)local_98,local_a0,(ComponentConstPtr *)local_58._16_8_);
      if (local_98._0_8_ != local_98._8_8_) {
        psVar9 = (string *)local_98._0_8_;
        do {
          Model::units(&local_c8,
                       (string *)
                       (local_a8->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
          if ((element_type *)
              local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
              _vptr_Entity == (element_type *)0x0) {
            Units::create((Units *)local_78,psVar9);
            uVar2 = local_78[0]._8_8_;
            local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity = (_func_int **)local_78[0]._0_8_;
            this = local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                   super_Entity.mPimpl;
            local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            mPimpl = (EntityImpl *)local_78[0]._8_8_;
            local_78[0]._M_allocated_capacity = (Variable *)0x0;
            local_78[0]._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78[0]._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78[0]._8_8_);
            }
          }
          else {
            referencedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                             *)local_78,local_a8,(UnitsPtr *)&local_c8);
            uVar2._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
                          _M_use_count;
            uVar2._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
                          _M_weak_count;
            std::
            vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>>
                      ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                        *)__return_storage_ptr__,uVar2,local_78[0]._M_allocated_capacity,
                       local_78[0]._8_8_);
            std::
            vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)local_78);
          }
          std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_c8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
              mPimpl != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                       super_Entity.mPimpl);
          }
          psVar9 = psVar9 + 1;
        } while (psVar9 != (string *)local_98._8_8_);
      }
      for (uVar10 = 0; sVar8 = ComponentEntity::componentCount(*(ComponentEntity **)local_a0),
          uVar10 < sVar8; uVar10 = uVar10 + 1) {
        ComponentEntity::component(&local_c8.super_ComponentEntity,*(size_t *)local_a0);
        local_58._0_8_ =
             local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_58._8_8_ =
             local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            mPimpl != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                    super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                         super_Entity.mPimpl + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                    super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                         super_Entity.mPimpl + 8) + 1;
          }
        }
        unitsUsed((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   *)local_78,local_a8,(ComponentConstPtr *)local_58);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        uVar3._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
                      _M_use_count;
        uVar3._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
                      _M_weak_count;
        std::
        vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>>
                  ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                    *)__return_storage_ptr__,uVar3,local_78[0]._M_allocated_capacity,
                   local_78[0]._8_8_);
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   *)local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            mPimpl != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                     super_Entity.mPimpl);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      return (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              *)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    }
    Component::variable((Component *)local_78,*(size_t *)local_a0);
    Variable::units((Variable *)local_78[0]._0_8_);
    if ((element_type *)
        local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
        _vptr_Entity == (element_type *)0x0) {
      psVar9 = (string *)
               (local_a8->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
LAB_0025a802:
      if (psVar9 == (string *)0x0) {
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_c8);
      }
    }
    else {
      NamedEntity::name_abi_cxx11_
                ((string *)local_98,
                 (NamedEntity *)
                 local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 _vptr_Entity);
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                      *)standardUnitsList_abi_cxx11_,(string *)local_98);
      pMVar5 = local_a8;
      psVar9 = (string *)
               (local_a8->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      bVar11 = psVar9 == (string *)0x0;
      if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        psVar9 = (string *)
                 (pMVar5->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      __return_storage_ptr__ =
           (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            *)local_c8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
              super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (cVar7._M_node != (_Base_ptr)(standardUnitsList_abi_cxx11_ + 8) || bVar11)
      goto LAB_0025a802;
      NamedEntity::name_abi_cxx11_
                ((string *)local_98,
                 (NamedEntity *)
                 local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 _vptr_Entity);
      Model::units((Model *)local_58,psVar9);
      if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      pMVar4 = (Model *)local_58;
      if ((element_type *)local_58._0_8_ == (element_type *)0x0) {
        pMVar4 = &local_c8;
      }
      local_38 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(pMVar4->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                          super_Entity + 8);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_38->_M_use_count = (int)*(size_type *)&local_38->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_38->_M_use_count = (int)*(size_type *)&local_38->_M_use_count + 1;
        }
      }
      referencedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)local_98,local_a8,(UnitsPtr *)(local_58 + 0x18));
      uVar1._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
                    _M_use_count;
      uVar1._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__)->
                    _M_weak_count;
      std::
      vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>>
                ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                  *)__return_storage_ptr__,uVar1,local_98._0_8_,local_98._8_8_);
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)(local_58 + 0x18));
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                 *)local_98);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78[0]._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78[0]._8_8_);
    }
    local_58._16_8_ =
         (long)&((__shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                local_58._16_8_)->_M_ptr + 1;
  } while( true );
}

Assistant:

std::vector<UnitsPtr> unitsUsed(const ModelPtr &model, const ComponentConstPtr &component)
{
    std::vector<UnitsPtr> usedUnits;

    // Get all the units used by variables in this component.

    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto v = component->variable(i);
        auto u = v->units();
        if ((u != nullptr) && !isStandardUnitName(u->name()) && (model != nullptr)) {
            auto modelUnits = model->units(u->name());
            auto availableUnits = modelUnits ? modelUnits : u;
            auto requiredUnits = referencedUnits(model, availableUnits);
            usedUnits.insert(usedUnits.end(), requiredUnits.begin(), requiredUnits.end());
            usedUnits.push_back(availableUnits);
        } else if (model == nullptr) {
            usedUnits.push_back(u);
        }
    }

    // Get all the units used by cn elements in the components maths.

    auto componentCnUnitsNames = findComponentCnUnitsNames(component);
    for (const auto &unitsName : componentCnUnitsNames) {
        auto u = model->units(unitsName);
        if (u == nullptr) {
            // We have used a units in the math but it is not defined in the given model, so send back a units that isn't defined.
            u = Units::create(unitsName);
        } else {
            auto requiredUnits = referencedUnits(model, u);
            usedUnits.insert(usedUnits.end(), requiredUnits.begin(), requiredUnits.end());
        }
        usedUnits.push_back(u);
    }

    // Get all the units used by child components of this component.

    for (size_t i = 0; i < component->componentCount(); ++i) {
        auto childComponent = component->component(i);
        auto childUsedUnits = unitsUsed(model, childComponent);
        usedUnits.insert(usedUnits.end(), childUsedUnits.begin(), childUsedUnits.end());
    }

    return usedUnits;
}